

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::skip_whitespace
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this)

{
  uint *puVar1;
  parse_state pVar2;
  uint *puVar3;
  size_t sVar4;
  
  puVar1 = (uint *)this->end_input_;
  puVar3 = (uint *)this->input_ptr_;
  if (puVar3 != puVar1) {
    do {
      if (this->state_ == cr) {
        this->line_ = this->line_ + 1;
        if (*puVar3 == 10) {
          this->input_ptr_ = (char_type_conflict *)(puVar3 + 1);
          sVar4 = this->position_ + 1;
          this->position_ = sVar4;
        }
        else {
          sVar4 = this->position_;
        }
        this->mark_position_ = sVar4;
        pVar2 = pop_state(this);
        this->state_ = pVar2;
      }
      else {
        if (0x20 < (ulong)*puVar3) {
          return;
        }
        if ((0x100002600U >> ((ulong)*puVar3 & 0x3f) & 1) == 0) {
          return;
        }
        skip_space(this,&this->input_ptr_);
      }
      puVar3 = (uint *)this->input_ptr_;
    } while (puVar3 != puVar1);
  }
  return;
}

Assistant:

void skip_whitespace()
    {
        const char_type* local_input_end = end_input_;

        while (input_ptr_ != local_input_end) 
        {
            switch (state_)
            {
                case parse_state::cr:
                    ++line_;
                    //++position_;
                    switch (*input_ptr_)
                    {
                        case '\n':
                            ++input_ptr_;
                            ++position_;
                            mark_position_ = position_;
                            state_ = pop_state();
                            break;
                        default:
                            mark_position_ = position_;
                            state_ = pop_state();
                            break;
                    }
                    break;

                default:
                    switch (*input_ptr_)
                    {
                        case ' ':case '\t':case '\n':case '\r':
                            skip_space(&input_ptr_);
                            break;
                        default:
                            return;
                    }
                    break;
            }
        }
    }